

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

vector<uint256,_std::allocator<uint256>_> * LocatorEntries(CBlockIndex *index)

{
  long lVar1;
  CBlockIndex *in_RSI;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  int height;
  int step;
  vector<uint256,_std::allocator<uint256>_> *have;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffff78;
  CBlockIndex *in_stack_ffffffffffffff80;
  CBlockIndex *in_stack_ffffffffffffff88;
  uint256 *this;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint3 in_stack_ffffffffffffffb8;
  uint uVar2;
  undefined4 uVar3;
  CBlockIndex *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 1;
  uVar2 = (uint)in_stack_ffffffffffffffb8;
  this = in_RDI;
  std::vector<uint256,_std::allocator<uint256>_>::vector(in_stack_ffffffffffffff78);
  if (in_RSI != (CBlockIndex *)0x0) {
    std::vector<uint256,_std::allocator<uint256>_>::reserve
              ((vector<uint256,_std::allocator<uint256>_> *)CONCAT44(uVar3,uVar2),
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_40 = in_RSI;
    while (local_40 != (CBlockIndex *)0x0) {
      CBlockIndex::GetBlockHash(in_stack_ffffffffffffff88);
      std::vector<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                ((vector<uint256,_std::allocator<uint256>_> *)this,in_RDI);
      if (local_40->nHeight == 0) break;
      in_stack_ffffffffffffff88 =
           (CBlockIndex *)
           std::max<int>((int *)in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78);
      local_40 = CBlockIndex::GetAncestor
                           ((CBlockIndex *)
                            CONCAT44(in_stack_ffffffffffffffa4,
                                     *(int *)&in_stack_ffffffffffffff88->phashBlock),
                            (int)((ulong)this >> 0x20));
      in_stack_ffffffffffffff80 = local_40;
      std::vector<uint256,_std::allocator<uint256>_>::size(in_stack_ffffffffffffff78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<uint256,_std::allocator<uint256>_> *)this;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<uint256> LocatorEntries(const CBlockIndex* index)
{
    int step = 1;
    std::vector<uint256> have;
    if (index == nullptr) return have;

    have.reserve(32);
    while (index) {
        have.emplace_back(index->GetBlockHash());
        if (index->nHeight == 0) break;
        // Exponentially larger steps back, plus the genesis block.
        int height = std::max(index->nHeight - step, 0);
        // Use skiplist.
        index = index->GetAncestor(height);
        if (have.size() > 10) step *= 2;
    }
    return have;
}